

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mcpl.c
# Opt level: O0

mcpl_outfile_t mcpl_forcemerge_files(char *file_output,uint nfiles,char **files,int keep_userflags)

{
  mcpl_file_t source;
  bool bVar1;
  int iVar2;
  int iVar3;
  mcpl_file_t mVar4;
  uint64_t uVar5;
  mcpl_particle_t *pmVar6;
  int in_ECX;
  long in_RDX;
  char *pcVar7;
  uint in_ESI;
  undefined8 in_RDI;
  void *pvVar8;
  uint64_t np;
  mcpl_outfileinternal_t *out_internal;
  uint64_t np_1;
  mcpl_file_t f_1;
  double uw;
  int32_t updg;
  mcpl_file_t f;
  int disallow_universalweight;
  double lastseen_universalweight;
  int disallow_universalpdg;
  int lastseen_universalpdg;
  int opt_uf;
  int opt_pol;
  int opt_dp;
  int normal_merge_ok;
  uint ifile;
  mcpl_outfile_t out;
  char *in_stack_ffffffffffffff78;
  mcpl_file_t in_stack_ffffffffffffff80;
  char *in_stack_ffffffffffffff88;
  char *in_stack_ffffffffffffff90;
  char **in_stack_ffffffffffffffa8;
  uint in_stack_ffffffffffffffb4;
  char **in_stack_ffffffffffffffb8;
  mcpl_outfile_t target;
  int iVar9;
  uint in_stack_ffffffffffffffc4;
  int iVar10;
  undefined4 in_stack_ffffffffffffffc8;
  int iVar11;
  undefined4 in_stack_ffffffffffffffcc;
  int iVar12;
  uint local_28;
  void *local_8;
  
  if (in_ESI == 0) {
    mcpl_error((char *)0x1063ec);
  }
  mcpl_error_on_dups(in_stack_ffffffffffffffb4,in_stack_ffffffffffffffa8);
  iVar2 = mcpl_file_certainly_exists(in_stack_ffffffffffffff90);
  if (iVar2 != 0) {
    mcpl_error((char *)0x106415);
  }
  bVar1 = true;
  local_28 = 1;
  do {
    if (in_ESI <= local_28) {
LAB_00106467:
      if (bVar1) {
        printf("MCPL mcpl_forcemerge_files called with %i files that are compatible for a standard merge => falling back to standard mcpl_merge_files function\n"
               ,(ulong)in_ESI);
        local_8 = (void *)mcpl_merge_files((char *)CONCAT44(in_stack_ffffffffffffffcc,
                                                            in_stack_ffffffffffffffc8),
                                           in_stack_ffffffffffffffc4,in_stack_ffffffffffffffb8);
      }
      else {
        bVar1 = false;
        iVar12 = 0;
        iVar11 = 0;
        iVar10 = 0;
        iVar9 = 0;
        iVar2 = 0;
        target.internal = (void *)0x0;
        for (local_28 = 0; local_28 < in_ESI; local_28 = local_28 + 1) {
          mVar4 = mcpl_open_file(in_stack_ffffffffffffff78);
          uVar5 = mcpl_hdr_nparticles(mVar4);
          if (uVar5 == 0) {
            mcpl_close_file(in_stack_ffffffffffffff80);
            pvVar8 = target.internal;
          }
          else {
            iVar3 = mcpl_hdr_has_userflags(mVar4);
            if (iVar3 != 0) {
              iVar11 = 1;
            }
            iVar3 = mcpl_hdr_has_polarisation(mVar4);
            if (iVar3 != 0) {
              iVar12 = 1;
            }
            iVar3 = mcpl_hdr_has_doubleprec(mVar4);
            if (iVar3 != 0) {
              bVar1 = true;
            }
            iVar3 = mcpl_hdr_universal_pdgcode(mVar4);
            if ((iVar3 == 0) || ((iVar10 != 0 && (iVar10 != iVar3)))) {
              iVar9 = 1;
              iVar3 = iVar10;
            }
            iVar10 = iVar3;
            pvVar8 = (void *)mcpl_hdr_universal_weight(mVar4);
            if ((((double)pvVar8 == 0.0) && (!NAN((double)pvVar8))) ||
               ((((double)target.internal != 0.0 || (NAN((double)target.internal))) &&
                (((double)target.internal != (double)pvVar8 ||
                 (NAN((double)target.internal) || NAN((double)pvVar8))))))) {
              iVar2 = 1;
              pvVar8 = target.internal;
            }
            mcpl_close_file(in_stack_ffffffffffffff80);
          }
          target.internal = pvVar8;
        }
        if (in_ECX == 0) {
          iVar11 = 0;
        }
        local_8 = (void *)mcpl_create_outfile(in_stack_ffffffffffffff88);
        iVar3 = mcpl_internal_fakeconstantversion(0);
        if (iVar3 == 0) {
          mcpl_hdr_set_srcname
                    ((mcpl_outfile_t)in_stack_ffffffffffffff80.internal,in_stack_ffffffffffffff78);
        }
        else {
          mcpl_hdr_set_srcname
                    ((mcpl_outfile_t)in_stack_ffffffffffffff80.internal,in_stack_ffffffffffffff78);
        }
        if (iVar11 != 0) {
          mcpl_enable_userflags((mcpl_outfile_t)in_stack_ffffffffffffff80.internal);
        }
        if (iVar12 != 0) {
          mcpl_enable_polarisation((mcpl_outfile_t)in_stack_ffffffffffffff80.internal);
        }
        if (bVar1) {
          mcpl_enable_doubleprec((mcpl_outfile_t)in_stack_ffffffffffffff80.internal);
        }
        if ((iVar9 == 0) && (iVar10 != 0)) {
          mcpl_enable_universal_pdgcode
                    ((mcpl_outfile_t)in_stack_ffffffffffffff80.internal,
                     (int32_t)((ulong)in_stack_ffffffffffffff78 >> 0x20));
        }
        if ((iVar2 == 0) && (((double)target.internal != 0.0 || (NAN((double)target.internal))))) {
          mcpl_enable_universal_weight
                    ((mcpl_outfile_t)in_stack_ffffffffffffff80.internal,
                     (double)in_stack_ffffffffffffff78);
        }
        for (local_28 = 0; local_28 < in_ESI; local_28 = local_28 + 1) {
          mVar4 = mcpl_open_file(in_stack_ffffffffffffff78);
          uVar5 = mcpl_hdr_nparticles(mVar4);
          pcVar7 = "s";
          if (uVar5 == 1) {
            pcVar7 = "";
          }
          printf("MCPL force-merge: Transferring %lu particle%s from file %s\n",uVar5,pcVar7,
                 *(undefined8 *)(in_RDX + (ulong)local_28 * 8));
          while (mVar4.internal._4_4_ = iVar12, mVar4.internal._0_4_ = iVar11,
                pmVar6 = mcpl_read(mVar4), pmVar6 != (mcpl_particle_t *)0x0) {
            source.internal._4_4_ = iVar10;
            source.internal._0_4_ = iVar9;
            mcpl_transfer_last_read_particle(source,target);
          }
          mcpl_close_file(in_stack_ffffffffffffff80);
        }
        pcVar7 = "s";
        if (*(long *)((long)local_8 + 0x68) == 1) {
          pcVar7 = "";
        }
        printf("MCPL force-merge: Transferred a total of %lu particle%s to new file %s\n",
               *(long *)((long)local_8 + 0x68),pcVar7,in_RDI);
      }
      return (mcpl_outfile_t)local_8;
    }
    iVar2 = mcpl_can_merge(in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
    if (iVar2 == 0) {
      bVar1 = false;
      goto LAB_00106467;
    }
    local_28 = local_28 + 1;
  } while( true );
}

Assistant:

mcpl_outfile_t mcpl_forcemerge_files( const char * file_output,
                                      unsigned nfiles,
                                      const char ** files,
                                      int keep_userflags )
{
  ////////////////////////////////////
  // Initial sanity check of input: //
  ////////////////////////////////////

  if (!nfiles)
    mcpl_error("mcpl_forcemerge_files must be called"
               " with at least one input file");

  mcpl_error_on_dups(nfiles,files);

  //Create new file:
  if (mcpl_file_certainly_exists(file_output))
    mcpl_error("requested output file of mcpl_forcemerge_files already exists");

  ///////////////////////////////////////////
  // Fallback to normal merge if possible: //
  ///////////////////////////////////////////

  //Check all files for compatibility before we start (for robustness, we check
  //again when actually merging each file).
  unsigned ifile;
  int normal_merge_ok = 1;
  for (ifile = 1; ifile < nfiles; ++ifile) {
    if (!mcpl_can_merge(files[0],files[ifile])) {
      normal_merge_ok = 0;
      break;
    }
  }
  if (normal_merge_ok) {
    printf("MCPL mcpl_forcemerge_files called with %i files that are"
           " compatible for a standard merge => falling back to"
           " standard mcpl_merge_files function\n",nfiles);
    return mcpl_merge_files(file_output,nfiles,files);
  }

  /////////////////////////////
  // Actual forcemerge code: //
  /////////////////////////////

  //Run through files and collect meta-data:
  int opt_dp = 0;
  int opt_pol = 0;
  int opt_uf = 0;
  int lastseen_universalpdg = 0;
  int disallow_universalpdg = 0;
  double lastseen_universalweight = 0;
  int disallow_universalweight = 0;

  for (ifile = 0; ifile < nfiles; ++ifile) {
    mcpl_file_t f = mcpl_open_file(files[ifile]);
    if (!mcpl_hdr_nparticles(f)) {
      mcpl_close_file(f);
      continue;//won't affect anything
    }

    if (mcpl_hdr_has_userflags(f))
      opt_uf = 1;//enable if any

    if (mcpl_hdr_has_polarisation(f))
      opt_pol = 1;//enable if any

    if (mcpl_hdr_has_doubleprec(f))
      opt_dp = 1;

    int32_t updg = mcpl_hdr_universal_pdgcode(f);
    if ( !updg
         || ( lastseen_universalpdg && lastseen_universalpdg != updg ) ) {
      disallow_universalpdg = 1;
    } else {
      lastseen_universalpdg = updg;
    }
    double uw = mcpl_hdr_universal_weight(f);
    if ( !uw
         || ( lastseen_universalweight && lastseen_universalweight != uw ) ) {
      disallow_universalweight = 1;
    } else {
      lastseen_universalweight = uw;
    }
    mcpl_close_file(f);
  }
  if (!keep_userflags)
    opt_uf = 0;

  mcpl_outfile_t out = mcpl_create_outfile(file_output);

  if ( mcpl_internal_fakeconstantversion(0) )
    mcpl_hdr_set_srcname(out,"mcpl_forcemerge_files (from MCPL v" "99.99.99" ")");
  else
    mcpl_hdr_set_srcname(out,"mcpl_forcemerge_files (from MCPL v" MCPL_VERSION_STR ")");
  if ( opt_uf )
    mcpl_enable_userflags(out);
  if ( opt_pol )
    mcpl_enable_polarisation(out);
  if (opt_dp)
    mcpl_enable_doubleprec(out);
  if ( !disallow_universalpdg && lastseen_universalpdg )
    mcpl_enable_universal_pdgcode(out,lastseen_universalpdg);
  if ( !disallow_universalweight && lastseen_universalweight )
    mcpl_enable_universal_weight(out,lastseen_universalweight);

  //Finally, perform the transfer:
  for (ifile = 0; ifile < nfiles; ++ifile) {
    mcpl_file_t f = mcpl_open_file(files[ifile]);
    uint64_t np = mcpl_hdr_nparticles(f);
    printf("MCPL force-merge: Transferring %" PRIu64
           " particle%s from file %s\n",
           np,(np==1?"":"s"),files[ifile]);
    while ( mcpl_read(f) != 0 )
      mcpl_transfer_last_read_particle(f, out);//lossless transfer when possible
    mcpl_close_file(f);
  }

  mcpl_outfileinternal_t * out_internal = (mcpl_outfileinternal_t *)out.internal;
  uint64_t np = out_internal->nparticles;
  printf("MCPL force-merge: Transferred a total of %" PRIu64
         " particle%s to new file %s\n",
         np,(np==1?"":"s"),file_output);
  return out;
}